

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O2

void crnlib::rg_etc1::etc1_block::get_diff_subblock_colors
               (color_quad_u8 *pDst,uint16 packed_color5,uint table_idx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  component_t cVar6;
  ulong uVar7;
  uint b;
  uint g;
  uint r;
  
  uVar7 = (ulong)table_idx;
  unpack_color5(&r,&g,&b,packed_color5,true);
  iVar4 = (&g_etc1_inten_tables)[uVar7 * 4];
  iVar5 = iVar4 + r;
  iVar2 = iVar4 + g;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  if (0xfe < iVar5) {
    iVar5 = 0xff;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  if (0xfe < iVar2) {
    iVar2 = 0xff;
  }
  iVar3 = (&DAT_001976e4)[uVar7 * 4];
  iVar1 = iVar4 + b;
  if ((int)(iVar4 + b) < 1) {
    iVar1 = 0;
  }
  (pDst->field_0).field_0.r = (component_t)iVar5;
  if (0xfe < iVar1) {
    iVar1 = 0xff;
  }
  (pDst->field_0).field_0.g = (component_t)iVar2;
  (pDst->field_0).field_0.b = (component_t)iVar1;
  iVar5 = iVar3 + r;
  iVar2 = iVar3 + g;
  iVar3 = iVar3 + b;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  if (0xfe < iVar5) {
    iVar5 = 0xff;
  }
  (pDst->field_0).field_0.a = 0xff;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  pDst[1].field_0.field_0.r = (component_t)iVar5;
  cVar6 = (component_t)iVar2;
  if (0xfe < iVar2) {
    cVar6 = 0xff;
  }
  pDst[1].field_0.field_0.g = cVar6;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  cVar6 = (component_t)iVar3;
  if (0xfe < iVar3) {
    cVar6 = 0xff;
  }
  pDst[1].field_0.field_0.b = cVar6;
  pDst[1].field_0.field_0.a = 0xff;
  iVar4 = *(int *)(&DAT_001976e8 + uVar7 * 0x10);
  iVar5 = iVar4 + r;
  iVar2 = iVar4 + g;
  iVar4 = iVar4 + b;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  if (0xfe < iVar5) {
    iVar5 = 0xff;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  pDst[2].field_0.field_0.r = (component_t)iVar5;
  cVar6 = (component_t)iVar2;
  if (0xfe < iVar2) {
    cVar6 = 0xff;
  }
  pDst[2].field_0.field_0.g = cVar6;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  cVar6 = (component_t)iVar4;
  if (0xfe < iVar4) {
    cVar6 = 0xff;
  }
  pDst[2].field_0.field_0.b = cVar6;
  pDst[2].field_0.field_0.a = 0xff;
  iVar5 = *(int *)(&DAT_001976ec + uVar7 * 0x10);
  iVar4 = r + iVar5;
  iVar2 = g + iVar5;
  iVar5 = iVar5 + b;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  cVar6 = (component_t)iVar4;
  if (0xfe < iVar4) {
    cVar6 = 0xff;
  }
  pDst[3].field_0.field_0.r = cVar6;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  cVar6 = (component_t)iVar2;
  if (0xfe < iVar2) {
    cVar6 = 0xff;
  }
  pDst[3].field_0.field_0.g = cVar6;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  cVar6 = (component_t)iVar5;
  if (0xfe < iVar5) {
    cVar6 = 0xff;
  }
  pDst[3].field_0.field_0.b = cVar6;
  pDst[3].field_0.field_0.a = 0xff;
  return;
}

Assistant:

void etc1_block::get_diff_subblock_colors(color_quad_u8* pDst, uint16 packed_color5, uint table_idx) {
  RG_ETC1_ASSERT(table_idx < cETC1IntenModifierValues);
  const int* pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

  uint r, g, b;
  unpack_color5(r, g, b, packed_color5, true);

  const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

  const int y0 = pInten_modifer_table[0];
  pDst[0].set(ir + y0, ig + y0, ib + y0);

  const int y1 = pInten_modifer_table[1];
  pDst[1].set(ir + y1, ig + y1, ib + y1);

  const int y2 = pInten_modifer_table[2];
  pDst[2].set(ir + y2, ig + y2, ib + y2);

  const int y3 = pInten_modifer_table[3];
  pDst[3].set(ir + y3, ig + y3, ib + y3);
}